

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

void __thiscall cmLocalNinjaGenerator::WriteProjectHeader(cmLocalNinjaGenerator *this,ostream *os)

{
  ostream *poVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *rng;
  string_view local_88;
  string_view local_78;
  string local_68;
  string local_38;
  ostream *local_18;
  ostream *os_local;
  cmLocalNinjaGenerator *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  cmGlobalNinjaGenerator::WriteDivider(os);
  poVar1 = std::operator<<(local_18,"# Project: ");
  cmLocalGenerator::GetProjectName_abi_cxx11_(&local_38,(cmLocalGenerator *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(poVar1,"# Configurations: ");
  rng = cmLocalCommonGenerator::GetConfigNames_abi_cxx11_(&this->super_cmLocalCommonGenerator);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78,", ");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_88);
  cmJoin(&local_68,rng,local_78,local_88);
  poVar1 = std::operator<<(poVar1,(string *)&local_68);
  std::operator<<(poVar1,'\n');
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_38);
  cmGlobalNinjaGenerator::WriteDivider(local_18);
  return;
}

Assistant:

void cmLocalNinjaGenerator::WriteProjectHeader(std::ostream& os)
{
  cmGlobalNinjaGenerator::WriteDivider(os);
  os << "# Project: " << this->GetProjectName() << '\n'
     << "# Configurations: " << cmJoin(this->GetConfigNames(), ", ") << '\n';
  cmGlobalNinjaGenerator::WriteDivider(os);
}